

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

size_t __thiscall r_comp::Metadata::get_size(Metadata *this)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Metadata *this_local;
  
  uVar1 = get_class_array_size(this);
  uVar2 = get_classes_size(this);
  uVar3 = get_sys_classes_size(this);
  sVar4 = get_class_names_size(this);
  sVar5 = get_operator_names_size(this);
  sVar6 = get_function_names_size(this);
  return uVar1 + uVar2 + uVar3 + sVar4 + sVar5 + sVar6;
}

Assistant:

size_t Metadata::get_size()
{
    return get_class_array_size() +
           get_classes_size() +
           get_sys_classes_size() +
           get_class_names_size() +
           get_operator_names_size() +
           get_function_names_size();
}